

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-zero-delay-observer.hxx
# Opt level: O1

void __thiscall
stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_0U>::setState
          (ZeroDelayObserver<4U,_3U,_0U> *this,StateVector *x_k,uint k)

{
  _Map_pointer ppIVar1;
  _Map_pointer ppIVar2;
  double dVar3;
  IndexedMatrix<3U,_1U> *pIVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->x_).k_ = k;
  dVar3 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0] = (x_k->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
        [0];
  (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1] = dVar3;
  dVar3 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2] = (x_k->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
        [2];
  (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3] = dVar3;
  (this->x_).isSet_ = true;
  while( true ) {
    ppIVar1 = (this->y_).
              super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppIVar2 = (this->y_).
              super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pIVar4 = (this->y_).
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->y_).
               super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pIVar4 >> 5) +
        ((long)(this->y_).
               super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->y_).
               super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
        ((((ulong)((long)ppIVar1 - (long)ppIVar2) >> 3) - 1) + (ulong)(ppIVar1 == (_Map_pointer)0x0)
        ) * 0x10 == 0) {
      return;
    }
    uVar5 = (long)pIVar4 -
            (long)(this->y_).
                  super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
    if (0xf < uVar5) {
      uVar6 = (uVar5 >> 4) + 0xf000000000000000;
      if (0 < (long)uVar5) {
        uVar6 = uVar5 >> 4;
      }
      pIVar4 = ppIVar2[uVar6] + uVar5 + uVar6 * -0x10;
    }
    if (pIVar4->isSet_ == false) break;
    if (k < pIVar4->k_) {
      return;
    }
    std::
    deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
    ::pop_front(&this->y_);
  }
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,
                "void stateObservation::compileTime::IndexedMatrix<3, 1>::check_() const [r = 3, c = 1]"
               );
}

Assistant:

void ZeroDelayObserver<n,m,p>::setState
(const typename ObserverBase<n,m,p>::StateVector& x_k,unsigned k)
{
    x_.set(x_k,k);
    while (y_.size()>0 && y_[0].getTime()<=k)
    {
        y_.pop_front();
    }

    if (p>0)
        while (u_.size()>0 && u_[0].getTime()<k)
        {
            u_.pop_front();
        }
}